

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.hpp
# Opt level: O2

void __thiscall rest_rpc::rpc_client::async_connect(rpc_client *this)

{
  address addr;
  anon_class_8_1_8991fb9c local_60;
  endpoint local_58;
  address local_3c;
  
  asio::ip::make_address(&local_3c,&this->host_);
  asio::ip::detail::endpoint::endpoint(&local_58,&local_3c,this->port_);
  local_60.this = this;
  asio::basic_socket<asio::ip::tcp,asio::any_io_executor>::
  async_connect<rest_rpc::rpc_client::async_connect()::_lambda(std::error_code_const&)_1_>
            ((basic_socket<asio::ip::tcp,asio::any_io_executor> *)&this->socket_,
             (endpoint_type *)&local_58,&local_60);
  return;
}

Assistant:

void async_connect() {
    assert(port_ != 0);
    auto addr = asio::ip::address::from_string(host_);
    socket_.async_connect({addr, port_}, [this](const asio::error_code &ec) {
      if (has_connected_ || stop_client_) {
        return;
      }

      if (ec) {
        // std::cout << ec.message() << std::endl;

        has_connected_ = false;

        if (reconnect_cnt_ <= 0) {
          return;
        }

        if (reconnect_cnt_ > 0) {
          reconnect_cnt_--;
        }

        async_reconnect();
      } else {
        // std::cout<<"connected ok"<<std::endl;
        if (is_ssl()) {
          handshake();
          return;
        }

        has_connected_ = true;
        do_read();
        resend_subscribe();
        if (has_wait_)
          conn_cond_.notify_one();
      }
    });
  }